

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

double helicsInputGetDouble(HelicsInput inp,HelicsError *err)

{
  InputObject *pIVar1;
  double dVar2;
  
  pIVar1 = anon_unknown.dwarf_694c0::verifyInput(inp,err);
  if (pIVar1 == (InputObject *)0x0) {
    dVar2 = -1e+49;
  }
  else {
    dVar2 = helics::Input::getValue_impl<double>(pIVar1->inputPtr);
  }
  return dVar2;
}

Assistant:

double helicsInputGetDouble(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return HELICS_INVALID_DOUBLE;
    }
    try {
        return inpObj->inputPtr->getValue<double>();
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_INVALID_DOUBLE;
    }
}